

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O3

void Map_MappingCuts(Map_Man_t *p)

{
  char cVar1;
  char cVar2;
  Map_Node_t *p_00;
  Map_Node_t *pMVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ProgressBar *p_01;
  Map_CutTable_t *p_02;
  Map_Cut_t **ppMVar10;
  int *piVar11;
  Map_Cut_t *pMVar12;
  Map_Cut_t *pMVar13;
  Map_Cut_t *pMVar14;
  Map_Cut_t *pMVar15;
  uint uVar16;
  Map_Cut_t *pRoot;
  long lVar17;
  undefined1 *puVar18;
  ulong uVar19;
  Map_Cut_t *pMVar20;
  Map_Node_t *pMVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  undefined1 *puVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  timespec ts;
  Map_Node_t *ppNodes [6];
  Map_Cut_t **local_138;
  ulong local_130;
  uint local_10c;
  uint local_108;
  long local_f8;
  Map_Cut_t **local_f0;
  Map_Cut_t *local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8 [8];
  ProgressBar *local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  Map_Node_t *local_68 [7];
  
  iVar6 = clock_gettime(3,(timespec *)local_c8);
  if (iVar6 < 0) {
    local_e0 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c8[1]),8);
    local_e0 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_c8[0] * -1000000;
  }
  if (4 < p->nVarsMax - 2U) {
    __assert_fail("p->nVarsMax > 1 && p->nVarsMax < 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                  ,0xb4,"void Map_MappingCuts(Map_Man_t *)");
  }
  if (0 < p->nInputs) {
    lVar17 = 0;
    do {
      Map_MappingCutsInput(p,p->pInputs[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->nInputs);
  }
  uVar9 = p->vMapObjs->nSize;
  uVar24 = (ulong)uVar9;
  p_01 = Extra_ProgressBarStart(_stdout,uVar9);
  p_02 = (Map_CutTable_t *)calloc(1,0x38);
  uVar16 = 9999;
  while( true ) {
    do {
      uVar27 = uVar16 + 1;
      uVar7 = uVar16 & 1;
      uVar16 = uVar27;
    } while (uVar7 != 0);
    if (uVar27 < 9) break;
    iVar6 = 5;
    while (uVar27 % (iVar6 - 2U) != 0) {
      uVar7 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar27 < uVar7) goto LAB_00375613;
    }
  }
LAB_00375613:
  p_02->nBins = uVar27;
  ppMVar10 = (Map_Cut_t **)calloc(1,(long)(int)uVar27 << 3);
  p_02->pBins = ppMVar10;
  piVar11 = (int *)malloc(8000);
  p_02->pCuts = piVar11;
  ppMVar10 = (Map_Cut_t **)malloc(16000);
  p_02->pArray = ppMVar10;
  ppMVar10 = (Map_Cut_t **)malloc(16000);
  p_02->pCuts1 = ppMVar10;
  ppMVar10 = (Map_Cut_t **)malloc(16000);
  p_02->pCuts2 = ppMVar10;
  if (0 < (int)uVar9) {
    lVar17 = 0;
    local_88 = p_01;
    local_80 = uVar24;
    do {
      p_00 = p->vMapObjs->pArray[lVar17];
      iVar6 = Map_NodeIsBuf(p_00);
      if (iVar6 == 0) {
        iVar6 = Map_NodeIsAnd(p_00);
        if (iVar6 != 0) {
          if (p_00->pCuts == (Map_Cut_t *)0x0) {
            pMVar21 = p_00->p1;
            pMVar3 = p_00->p2;
            pMVar13 = *(Map_Cut_t **)(((ulong)pMVar21 & 0xfffffffffffffffe) + 0xa0);
            pMVar14 = *(Map_Cut_t **)(((ulong)pMVar3 & 0xfffffffffffffffe) + 0xa0);
            local_c8[4] = 0;
            local_c8[5] = 0;
            local_c8[2] = 0;
            local_c8[3] = 0;
            local_c8[0] = 0;
            local_c8[1] = 0;
            local_c8[6] = 0;
            local_f0 = p_02->pCuts1;
            lVar23 = 0;
            lVar28 = 0;
            if (pMVar13 != (Map_Cut_t *)0x0) {
              lVar28 = 0;
              do {
                local_f0[lVar28] = pMVar13;
                pMVar13 = pMVar13->pNext;
                lVar28 = lVar28 + 1;
              } while (pMVar13 != (Map_Cut_t *)0x0);
            }
            ppMVar10 = p_02->pCuts2;
            if (pMVar14 != (Map_Cut_t *)0x0) {
              lVar23 = 0;
              do {
                ppMVar10[lVar23] = pMVar14;
                pMVar14 = pMVar14->pNext;
                lVar23 = lVar23 + 1;
              } while (pMVar14 != (Map_Cut_t *)0x0);
            }
            uVar9 = (uint)pMVar21 & 1;
            uVar7 = (uint)pMVar3 & 1;
            uVar27 = (uint)lVar28;
            uVar22 = (uint)lVar23;
            uVar16 = uVar27;
            local_138 = ppMVar10;
            local_10c = uVar22;
            local_108 = uVar7;
            if ((int)uVar22 < (int)uVar27) {
              uVar16 = uVar22;
              local_138 = local_f0;
              local_10c = uVar27;
              local_108 = uVar9;
              local_f0 = ppMVar10;
              uVar9 = uVar7;
            }
            local_130 = (ulong)uVar9;
            Map_CutTableRestart(p_02);
            local_70 = lVar17;
            if ((int)uVar16 < 1) {
              iVar6 = 0;
            }
            else {
              local_d0 = local_130;
              local_d8 = (ulong)local_108;
              local_78 = (ulong)uVar16;
              uVar24 = 0;
              local_f8 = 1;
              iVar6 = 0;
              do {
                lVar17 = 0;
                do {
                  pMVar13 = local_f0[uVar24];
                  pMVar14 = local_138[lVar17];
                  if (((p->nVarsMax != (int)pMVar13->nLeaves) ||
                      (pMVar13->nLeaves != pMVar14->nLeaves)) ||
                     ((pMVar13->ppLeaves[0] == pMVar14->ppLeaves[0] &&
                      (pMVar13->ppLeaves[1] == pMVar14->ppLeaves[1])))) {
                    iVar8 = Map_CutMergeTwo(pMVar13,pMVar14,local_68,p->nVarsMax);
                    if ((iVar8 != 0) &&
                       (pMVar12 = Map_CutTableConsider(p,p_02,local_68,iVar8),
                       pMVar12 != (Map_Cut_t *)0x0)) {
                      pMVar12->pOne = (Map_Cut_t *)((ulong)pMVar13 ^ local_d0);
                      pMVar12->pTwo = (Map_Cut_t *)((ulong)pMVar14 ^ local_d8);
                      pMVar12->pNext =
                           (Map_Cut_t *)(&((timespec *)local_c8)->tv_sec)[pMVar12->nLeaves];
                      (&((timespec *)local_c8)->tv_sec)[pMVar12->nLeaves] = (__time_t)pMVar12;
                      iVar6 = iVar6 + 1;
                      if (iVar6 == 1000) goto LAB_00375b3a;
                    }
                  }
                  lVar17 = lVar17 + 1;
                } while (local_f8 != lVar17);
                if (uVar24 != 0) {
                  uVar19 = 0;
                  do {
                    pMVar13 = local_f0[uVar19];
                    pMVar14 = local_138[uVar24];
                    if (((p->nVarsMax != (int)pMVar13->nLeaves) ||
                        (pMVar13->nLeaves != pMVar14->nLeaves)) ||
                       ((pMVar13->ppLeaves[0] == pMVar14->ppLeaves[0] &&
                        (pMVar13->ppLeaves[1] == pMVar14->ppLeaves[1])))) {
                      iVar8 = Map_CutMergeTwo(pMVar13,pMVar14,local_68,p->nVarsMax);
                      if ((iVar8 != 0) &&
                         (pMVar12 = Map_CutTableConsider(p,p_02,local_68,iVar8),
                         pMVar12 != (Map_Cut_t *)0x0)) {
                        pMVar12->pOne = (Map_Cut_t *)((ulong)pMVar13 ^ local_d0);
                        pMVar12->pTwo = (Map_Cut_t *)((ulong)pMVar14 ^ local_d8);
                        pMVar12->pNext =
                             (Map_Cut_t *)(&((timespec *)local_c8)->tv_sec)[pMVar12->nLeaves];
                        (&((timespec *)local_c8)->tv_sec)[pMVar12->nLeaves] = (__time_t)pMVar12;
                        iVar6 = iVar6 + 1;
                        if (iVar6 == 1000) goto LAB_00375b3a;
                      }
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar24 = uVar24 + 1;
                local_f8 = local_f8 + 1;
              } while (uVar24 != local_78);
            }
            if ((int)uVar16 < (int)local_10c) {
              if ((int)uVar22 < (int)uVar27) {
                uVar27 = uVar22;
              }
              lVar17 = (long)(int)uVar27;
              do {
                if (0 < (int)uVar16) {
                  uVar24 = 0;
                  do {
                    pMVar13 = local_f0[uVar24];
                    pMVar14 = local_138[lVar17];
                    if (((p->nVarsMax != (int)pMVar13->nLeaves) ||
                        (pMVar13->nLeaves != pMVar14->nLeaves)) ||
                       ((pMVar13->ppLeaves[0] == pMVar14->ppLeaves[0] &&
                        (pMVar13->ppLeaves[1] == pMVar14->ppLeaves[1])))) {
                      iVar8 = Map_CutMergeTwo(pMVar13,pMVar14,local_68,p->nVarsMax);
                      if ((iVar8 != 0) &&
                         (pMVar12 = Map_CutTableConsider(p,p_02,local_68,iVar8),
                         pMVar12 != (Map_Cut_t *)0x0)) {
                        pMVar12->pOne = (Map_Cut_t *)((ulong)pMVar13 ^ local_130);
                        pMVar12->pTwo = (Map_Cut_t *)((ulong)pMVar14 ^ (ulong)local_108);
                        pMVar12->pNext =
                             (Map_Cut_t *)(&((timespec *)local_c8)->tv_sec)[pMVar12->nLeaves];
                        (&((timespec *)local_c8)->tv_sec)[pMVar12->nLeaves] = (__time_t)pMVar12;
                        iVar6 = iVar6 + 1;
                        if (iVar6 == 1000) goto LAB_00375b3a;
                      }
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar16 != uVar24);
                }
                lVar17 = lVar17 + 1;
              } while ((uVar27 - uVar16) + local_10c != (int)lVar17);
            }
LAB_00375b3a:
            uVar24 = local_80;
            p_01 = local_88;
            local_e8 = (Map_Cut_t *)0x0;
            uVar9 = p->nVarsMax;
            puVar18 = (undefined1 *)&local_e8;
            if (0 < (int)uVar9) {
              lVar17 = 1;
              puVar18 = (undefined1 *)&local_e8;
              do {
                puVar4 = (undefined1 *)(&((timespec *)local_c8)->tv_sec)[lVar17];
                puVar5 = puVar4;
                if (puVar4 != (undefined1 *)0x0) {
                  do {
                    puVar25 = puVar5;
                    puVar5 = *(undefined1 **)puVar25;
                  } while (puVar5 != (undefined1 *)0x0);
                  *(undefined1 **)puVar18 = puVar4;
                  puVar18 = puVar25;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 != (ulong)uVar9 + 1);
            }
            *(undefined8 *)puVar18 = 0;
            pMVar13 = Map_CutSortCuts(p,p_02,local_e8);
            if (pMVar13 == (Map_Cut_t *)0x0) {
              __assert_fail("pList",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                            ,0xf2,
                            "Map_Cut_t *Map_CutCompute(Map_Man_t *, Map_CutTable_t *, Map_Node_t *)"
                           );
            }
            if (p_00->pRepr == (Map_Node_t *)0x0) {
              for (pMVar21 = p_00->pNextE; pMVar21 != (Map_Node_t *)0x0; pMVar21 = pMVar21->pNextE)
              {
                pMVar14 = pMVar21->pCuts;
                pMVar12 = pMVar13;
                if (pMVar14 == (Map_Cut_t *)0x0) {
                  __assert_fail("pTemp->pCuts",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                                ,0xf8,
                                "Map_Cut_t *Map_CutCompute(Map_Man_t *, Map_CutTable_t *, Map_Node_t *)"
                               );
                }
                do {
                  pMVar20 = pMVar12;
                  pMVar12 = pMVar20->pNext;
                } while (pMVar12 != (Map_Cut_t *)0x0);
                pMVar20->pNext = pMVar14->pNext;
                pMVar14->pNext = (Map_Cut_t *)0x0;
                pMVar13 = Map_CutSortCuts(p,p_02,pMVar13);
              }
            }
            pMVar14 = Map_CutAlloc(p);
            lVar17 = local_70;
            pMVar14->nLeaves = '\x01';
            pMVar14->ppLeaves[0] = p_00;
            pMVar14->uTruth = 0xaaaaaaaa;
            pMVar14->pNext = pMVar13;
            p_00->pCuts = pMVar14;
joined_r0x00375c06:
            pMVar20 = pMVar13;
            pMVar12 = pMVar14;
            if (pMVar20 != (Map_Cut_t *)0x0) {
              pMVar13 = pMVar20->pNext;
              pMVar15 = p_00->pCuts;
              do {
                pMVar15 = pMVar15->pNext;
                pMVar14 = pMVar20;
                if (pMVar15 == pMVar20) goto joined_r0x00375c06;
                cVar1 = pMVar15->nLeaves;
                if (cVar1 < '\x01') {
                  uVar19 = 0;
                }
                else {
                  cVar2 = pMVar20->nLeaves;
                  uVar19 = 0;
                  while( true ) {
                    if (cVar2 < '\x01') {
                      uVar26 = 0;
                    }
                    else {
                      uVar26 = 0;
                      while (pMVar15->ppLeaves[uVar19] != pMVar20->ppLeaves[uVar26]) {
                        uVar26 = uVar26 + 1;
                        if ((uint)(int)cVar2 == uVar26) goto LAB_00375c65;
                      }
                    }
                    if ((uint)uVar26 == (int)cVar2) break;
                    uVar19 = uVar19 + 1;
                    if (uVar19 == (uint)(int)cVar1) goto LAB_00375c69;
                  }
                }
LAB_00375c65:
              } while ((uint)uVar19 != (int)cVar1);
LAB_00375c69:
              pMVar12->pNext = pMVar13;
              Map_CutFree(p,pMVar20);
              pMVar14 = pMVar12;
              goto joined_r0x00375c06;
            }
            if ((p_00->pRepr != (Map_Node_t *)0x0) &&
               (iVar6 = Map_NodeComparePhase(p_00,p_00->pRepr), iVar6 != 0)) {
              for (pMVar13 = p_00->pCuts; pMVar13 != (Map_Cut_t *)0x0; pMVar13 = pMVar13->pNext) {
                pMVar13->Phase = '\x01';
              }
            }
          }
          goto LAB_003756a9;
        }
      }
      else {
        Map_MappingCutsInput(p,p_00);
LAB_003756a9:
        if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar17)) {
          Extra_ProgressBarUpdate_int(p_01,(int)lVar17,"Cuts ...");
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != uVar24);
  }
  Extra_ProgressBarStop(p_01);
  if (p_02->pCuts1 != (Map_Cut_t **)0x0) {
    free(p_02->pCuts1);
  }
  if (p_02->pCuts2 != (Map_Cut_t **)0x0) {
    free(p_02->pCuts2);
  }
  if (p_02->pArray != (Map_Cut_t **)0x0) {
    free(p_02->pArray);
  }
  if (p_02->pBins != (Map_Cut_t **)0x0) {
    free(p_02->pBins);
  }
  if (p_02->pCuts != (int *)0x0) {
    free(p_02->pCuts);
  }
  free(p_02);
  if (p->fVerbose != 0) {
    uVar9 = Map_MappingCountAllCuts(p);
    iVar6 = 0x8a407e;
    printf("Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ",
           SUB84((double)((float)(int)uVar9 / (float)p->nNodes),0),(ulong)(uint)p->nNodes,
           (ulong)(uint)p->nVarsMax,(ulong)uVar9);
    Abc_Print(iVar6,"%s =","Time");
    iVar8 = 3;
    iVar6 = clock_gettime(3,(timespec *)local_c8);
    if (iVar6 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_c8[1] / 1000 + local_c8[0] * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",SUB84((double)(local_e0 + lVar17) / 1000000.0,0));
  }
  return;
}

Assistant:

void Map_MappingCuts( Map_Man_t * p )
{
    ProgressBar * pProgress;
    Map_CutTable_t * pTable;
    Map_Node_t * pNode;
    int nCuts, nNodes, i;
    abctime clk = Abc_Clock();
    // set the elementary cuts for the PI variables
    assert( p->nVarsMax > 1 && p->nVarsMax < 7 );
    for ( i = 0; i < p->nInputs; i++ )
        Map_MappingCutsInput( p, p->pInputs[i] );

    // compute the cuts for the internal nodes
    nNodes = p->vMapObjs->nSize;
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    pTable = Map_CutTableStart( p );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
        if ( Map_NodeIsBuf(pNode) )
            Map_MappingCutsInput( p, pNode );
        else if ( Map_NodeIsAnd(pNode) )
            Map_CutCompute( p, pTable, pNode );
        else continue;
        Extra_ProgressBarUpdate( pProgress, i, "Cuts ..." );
    }
    Extra_ProgressBarStop( pProgress );
    Map_CutTableStop( pTable );

    // report the stats
    if ( p->fVerbose )
    {
        nCuts = Map_MappingCountAllCuts(p);
        printf( "Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ", 
               p->nNodes, p->nVarsMax, nCuts, ((float)nCuts)/p->nNodes );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // print the cuts for the first primary output
//    Map_CutListPrint( p, Map_Regular(p->pOutputs[0]) );
}